

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O3

void __thiscall Sms_Apu::write_ggstereo(Sms_Apu *this,blip_time_t time,int data)

{
  int iVar1;
  Sms_Osc *pSVar2;
  Blip_Buffer *buf;
  Blip_Buffer *pBVar3;
  uint uVar4;
  int i;
  long lVar5;
  
  run_until(this,time);
  lVar5 = 0;
  do {
    uVar4 = data >> ((byte)lVar5 & 0x1f);
    pSVar2 = this->oscs[lVar5];
    buf = pSVar2->output;
    uVar4 = uVar4 & 1 | uVar4 >> 3 & 2;
    pSVar2->output_select = uVar4;
    pBVar3 = pSVar2->outputs[uVar4];
    pSVar2->output = pBVar3;
    if ((pBVar3 != buf) && (iVar1 = pSVar2->last_amp, iVar1 != 0)) {
      if (buf != (Blip_Buffer *)0x0) {
        buf->modified_ = 1;
        Blip_Synth<12,_1>::offset(&this->square_synth,time,-iVar1,buf);
      }
      pSVar2->last_amp = 0;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void Sms_Apu::write_ggstereo( blip_time_t time, int data )
{
	require( (unsigned) data <= 0xFF );
	
	run_until( time );
	
	for ( int i = 0; i < osc_count; i++ )
	{
		Sms_Osc& osc = *oscs [i];
		int flags = data >> i;
		Blip_Buffer* old_output = osc.output;
		osc.output_select = (flags >> 3 & 2) | (flags & 1);
		osc.output = osc.outputs [osc.output_select];
		if ( osc.output != old_output && osc.last_amp )
		{
			if ( old_output )
			{
				old_output->set_modified();
				square_synth.offset( time, -osc.last_amp, old_output );
			}
			osc.last_amp = 0;
		}
	}
}